

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_suba(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg2;
  TCGv_i32 *ppTVar1;
  uint uVar2;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg2 = gen_ea(env,s,insn,((insn >> 8 & 1) != 0) + 1,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (arg2 != tcg_ctx->NULL_QREG) {
    uVar2 = insn >> 9 & 7;
    if (((uint)s->writeback_mask >> uVar2 & 1) == 0) {
      ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar1 = s->writeback;
    }
    tcg_gen_sub_i32(tcg_ctx,ppTVar1[uVar2],ppTVar1[uVar2],arg2);
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(suba)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;

    SRC_EA(env, src, (insn & 0x100) ? OS_LONG : OS_WORD, 1, NULL);
    reg = AREG(insn, 9);
    tcg_gen_sub_i32(tcg_ctx, reg, reg, src);
}